

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O0

UniValue * MempoolToJSON(CTxMemPool *pool,bool verbose,bool include_mempool_sequence)

{
  bool bVar1;
  undefined8 uVar2;
  UniValue *this;
  byte in_CL;
  byte in_DL;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  CTxMemPoolEntry *e_1;
  vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  *__range2_1;
  CTxMemPoolEntry *e;
  vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  *__range2;
  UniValue *o;
  iterator __end2_1;
  iterator __begin2_1;
  uint64_t mempool_sequence;
  iterator __end2;
  iterator __begin2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  UniValue a;
  UniValue info;
  CTxMemPool *in_stack_fffffffffffffb58;
  UniValue *in_stack_fffffffffffffb60;
  UniValue *in_stack_fffffffffffffb68;
  UniValue *in_stack_fffffffffffffb70;
  UniValue *in_stack_fffffffffffffb78;
  UniValue *this_00;
  UniValue *in_stack_fffffffffffffb80;
  char *in_stack_fffffffffffffb88;
  CTransaction *in_stack_fffffffffffffb90;
  string *in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffba0;
  UniValue *this_01;
  CTxMemPool *in_stack_fffffffffffffba8;
  allocator<char> local_3ba;
  allocator<char> local_3b9;
  reference_wrapper<const_CTxMemPoolEntry> *local_3b8;
  reference_wrapper<const_CTxMemPoolEntry> *local_3b0;
  uint64_t local_390;
  reference_wrapper<const_CTxMemPoolEntry> *local_388;
  reference_wrapper<const_CTxMemPoolEntry> *local_380;
  UniValue local_2c0;
  undefined8 in_stack_fffffffffffffdd8;
  UniValue *in_stack_fffffffffffffde0;
  CTxMemPool *in_stack_fffffffffffffde8;
  UniValue local_1b0 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_DL & 1) == 0) {
    this_01 = local_1b0;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb70);
    UniValue::UniValue(in_stack_fffffffffffffb78,(VType)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                       (string *)in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb58);
    this = (UniValue *)
           MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                     ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffb58);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this,
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffb78 >> 0x18,0));
    CTxMemPool::entryAll(in_stack_fffffffffffffba8);
    local_3b0 = (reference_wrapper<const_CTxMemPoolEntry> *)
                std::
                vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                ::begin((vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                         *)in_stack_fffffffffffffb60);
    local_3b8 = (reference_wrapper<const_CTxMemPoolEntry> *)
                std::
                vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                ::end((vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                       *)in_stack_fffffffffffffb60);
    while (bVar1 = __gnu_cxx::
                   operator==<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
                             ((__normal_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
                               *)in_stack_fffffffffffffb68,
                              (__normal_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
                               *)in_stack_fffffffffffffb60), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
      ::operator*((__normal_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
                   *)in_stack_fffffffffffffb58);
      std::reference_wrapper::operator_cast_to_CTxMemPoolEntry_
                ((reference_wrapper<const_CTxMemPoolEntry> *)in_stack_fffffffffffffb58);
      in_stack_fffffffffffffb90 =
           CTxMemPoolEntry::GetTx((CTxMemPoolEntry *)in_stack_fffffffffffffb58);
      CTransaction::GetHash((CTransaction *)in_stack_fffffffffffffb58);
      transaction_identifier<false>::ToString_abi_cxx11_
                ((transaction_identifier<false> *)in_stack_fffffffffffffb60);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffb90);
      UniValue::push_back(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffb58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb58);
      __gnu_cxx::
      __normal_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
      ::operator++((__normal_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
                    *)in_stack_fffffffffffffb58);
    }
    std::
    vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~vector((vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)in_stack_fffffffffffffb68);
    local_390 = CTxMemPool::GetSequence(in_stack_fffffffffffffb58);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffb58);
    if ((in_CL & 1) == 0) {
      UniValue::UniValue(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    }
    else {
      this_00 = (UniValue *)&stack0xfffffffffffffdb8;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb70);
      UniValue::UniValue(this_00,(VType)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                         (string *)in_stack_fffffffffffffb68);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffba8,(char *)this_01,(allocator<char> *)this);
      UniValue::UniValue(&local_2c0,in_stack_fffffffffffffb60);
      UniValue::pushKV(this_01,(string *)this,(UniValue *)in_stack_fffffffffffffb90);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffb58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb58);
      std::allocator<char>::~allocator(&local_3b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffba8,(char *)this_01,(allocator<char> *)this);
      UniValue::UniValue<unsigned_long_&,_unsigned_long,_true>
                (this,(unsigned_long *)in_stack_fffffffffffffb90);
      UniValue::pushKV(this_01,(string *)this,(UniValue *)in_stack_fffffffffffffb90);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffb58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb58);
      std::allocator<char>::~allocator(&local_3ba);
    }
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffffb58);
  }
  else {
    if ((in_CL & 1) != 0) {
      uVar2 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                 (allocator<char> *)in_stack_fffffffffffffb98);
      JSONRPCError((int)((ulong)in_stack_fffffffffffffba8 >> 0x20),in_stack_fffffffffffffb98);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_012ec7f8;
    }
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffb58);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffb98,
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffb78 >> 0x18,0));
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb70);
    UniValue::UniValue(in_stack_fffffffffffffb78,(VType)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                       (string *)in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb58);
    CTxMemPool::entryAll(in_stack_fffffffffffffba8);
    local_380 = (reference_wrapper<const_CTxMemPoolEntry> *)
                std::
                vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                ::begin((vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                         *)in_stack_fffffffffffffb60);
    local_388 = (reference_wrapper<const_CTxMemPoolEntry> *)
                std::
                vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                ::end((vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                       *)in_stack_fffffffffffffb60);
    while (bVar1 = __gnu_cxx::
                   operator==<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
                             ((__normal_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
                               *)in_stack_fffffffffffffb68,
                              (__normal_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
                               *)in_stack_fffffffffffffb60), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
      ::operator*((__normal_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
                   *)in_stack_fffffffffffffb58);
      std::reference_wrapper::operator_cast_to_CTxMemPoolEntry_
                ((reference_wrapper<const_CTxMemPoolEntry> *)in_stack_fffffffffffffb58);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb70);
      UniValue::UniValue(in_stack_fffffffffffffb78,(VType)((ulong)in_stack_fffffffffffffb70 >> 0x20)
                         ,(string *)in_stack_fffffffffffffb68);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb58);
      entryToJSON(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                  (CTxMemPoolEntry *)in_stack_fffffffffffffdd8);
      CTxMemPoolEntry::GetTx((CTxMemPoolEntry *)in_stack_fffffffffffffb58);
      CTransaction::GetHash((CTransaction *)in_stack_fffffffffffffb58);
      transaction_identifier<false>::ToString_abi_cxx11_
                ((transaction_identifier<false> *)in_stack_fffffffffffffb60);
      UniValue::UniValue(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      UniValue::pushKVEnd(in_stack_fffffffffffffb80,(string *)in_stack_fffffffffffffb78,
                          in_stack_fffffffffffffb70);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffb58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb58);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffb58);
      __gnu_cxx::
      __normal_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
      ::operator++((__normal_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_*,_std::vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>_>
                    *)in_stack_fffffffffffffb58);
    }
    std::
    vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~vector((vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)in_stack_fffffffffffffb68);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffb58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
LAB_012ec7f8:
  __stack_chk_fail();
}

Assistant:

UniValue MempoolToJSON(const CTxMemPool& pool, bool verbose, bool include_mempool_sequence)
{
    if (verbose) {
        if (include_mempool_sequence) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Verbose results cannot contain mempool sequence values.");
        }
        LOCK(pool.cs);
        UniValue o(UniValue::VOBJ);
        for (const CTxMemPoolEntry& e : pool.entryAll()) {
            UniValue info(UniValue::VOBJ);
            entryToJSON(pool, info, e);
            // Mempool has unique entries so there is no advantage in using
            // UniValue::pushKV, which checks if the key already exists in O(N).
            // UniValue::pushKVEnd is used instead which currently is O(1).
            o.pushKVEnd(e.GetTx().GetHash().ToString(), std::move(info));
        }
        return o;
    } else {
        UniValue a(UniValue::VARR);
        uint64_t mempool_sequence;
        {
            LOCK(pool.cs);
            for (const CTxMemPoolEntry& e : pool.entryAll()) {
                a.push_back(e.GetTx().GetHash().ToString());
            }
            mempool_sequence = pool.GetSequence();
        }
        if (!include_mempool_sequence) {
            return a;
        } else {
            UniValue o(UniValue::VOBJ);
            o.pushKV("txids", std::move(a));
            o.pushKV("mempool_sequence", mempool_sequence);
            return o;
        }
    }
}